

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall CoreML::Specification::GRULayerParams::SharedDtor(GRULayerParams *this)

{
  WeightParams *pWVar1;
  Arena *pAVar2;
  LogMessage *other;
  GRULayerParams *pGVar3;
  LogFinisher local_5d [20];
  byte local_49;
  LogMessage local_48;
  GRULayerParams *local_10;
  GRULayerParams *this_local;
  
  local_10 = this;
  pAVar2 = google::protobuf::MessageLite::GetArenaForAllocation(&this->super_MessageLite);
  local_49 = 0;
  if (pAVar2 != (Arena *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O0/mlmodel/format/NeuralNetwork.pb.cc"
               ,0x87e3);
    local_49 = 1;
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(local_5d,other);
  }
  if ((local_49 & 1) != 0) {
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  pGVar3 = internal_default_instance();
  if ((this != pGVar3) && (pWVar1 = this->updategateweightmatrix_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  pGVar3 = internal_default_instance();
  if ((this != pGVar3) && (pWVar1 = this->resetgateweightmatrix_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  pGVar3 = internal_default_instance();
  if ((this != pGVar3) && (pWVar1 = this->outputgateweightmatrix_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  pGVar3 = internal_default_instance();
  if ((this != pGVar3) && (pWVar1 = this->updategaterecursionmatrix_, pWVar1 != (WeightParams *)0x0)
     ) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  pGVar3 = internal_default_instance();
  if ((this != pGVar3) && (pWVar1 = this->resetgaterecursionmatrix_, pWVar1 != (WeightParams *)0x0))
  {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  pGVar3 = internal_default_instance();
  if ((this != pGVar3) && (pWVar1 = this->outputgaterecursionmatrix_, pWVar1 != (WeightParams *)0x0)
     ) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  pGVar3 = internal_default_instance();
  if ((this != pGVar3) && (pWVar1 = this->updategatebiasvector_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  pGVar3 = internal_default_instance();
  if ((this != pGVar3) && (pWVar1 = this->resetgatebiasvector_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  pGVar3 = internal_default_instance();
  if ((this != pGVar3) && (pWVar1 = this->outputgatebiasvector_, pWVar1 != (WeightParams *)0x0)) {
    WeightParams::~WeightParams(pWVar1);
    operator_delete(pWVar1,0x48);
  }
  return;
}

Assistant:

inline void GRULayerParams::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  if (this != internal_default_instance()) delete updategateweightmatrix_;
  if (this != internal_default_instance()) delete resetgateweightmatrix_;
  if (this != internal_default_instance()) delete outputgateweightmatrix_;
  if (this != internal_default_instance()) delete updategaterecursionmatrix_;
  if (this != internal_default_instance()) delete resetgaterecursionmatrix_;
  if (this != internal_default_instance()) delete outputgaterecursionmatrix_;
  if (this != internal_default_instance()) delete updategatebiasvector_;
  if (this != internal_default_instance()) delete resetgatebiasvector_;
  if (this != internal_default_instance()) delete outputgatebiasvector_;
}